

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# api_support.c
# Opt level: O0

ecs_entity_t ecs_new_entity(ecs_world_t *world,ecs_entity_t e,char *name,char *expr)

{
  EcsType EVar1;
  EcsType type;
  ecs_entity_t result;
  char *expr_local;
  char *name_local;
  ecs_entity_t e_local;
  ecs_world_t *world_local;
  
  type.normalized = (ecs_type_t)ecs_lookup_w_id(world,e,name);
  if (type.normalized == (ecs_type_t)0x0) {
    type.normalized = (ecs_type_t)ecs_new_w_type(world,(ecs_type_t)0x0);
    ecs_set_symbol(world,(ecs_entity_t)type.normalized,name);
  }
  EVar1 = type_from_expr(world,name,expr);
  type.type = EVar1.normalized;
  ecs_add_type(world,(ecs_entity_t)type.normalized,type.type);
  return (ecs_entity_t)type.normalized;
}

Assistant:

ecs_entity_t ecs_new_entity(
    ecs_world_t *world,
    ecs_entity_t e,
    const char *name,
    const char *expr)
{
    ecs_entity_t result = ecs_lookup_w_id(world, e, name);
    if (!result) {
        result = ecs_new(world, 0);
        ecs_set_symbol(world, result, name);
    }
    
    EcsType type = type_from_expr(world, name, expr);
    ecs_add_type(world, result, type.normalized);

    return result;
}